

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Error ps_parser_load_field_table
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  uint uVar3;
  undefined4 uVar4;
  FT_Error FVar5;
  FT_UInt FVar6;
  uint uVar7;
  int iVar8;
  T1_Token tokens;
  T1_FieldRec fieldrec;
  T1_TokenRec elements [32];
  uint local_36c;
  T1_FieldRec_ local_368;
  T1_TokenRec_ local_338 [32];
  
  local_368.ident = field->ident;
  uVar4 = field->location;
  local_368.reader = field->reader;
  local_368.offset = field->offset;
  local_368.size = field->size;
  local_368._29_3_ = *(undefined3 *)&field->field_0x1d;
  local_368.array_max = field->array_max;
  local_368.count_offset = field->count_offset;
  local_368.dict = field->dict;
  local_368._44_4_ = *(undefined4 *)&field->field_0x2c;
  local_368.type = T1_FIELD_TYPE_INTEGER;
  local_368.location = uVar4;
  if ((field->type == T1_FIELD_TYPE_FIXED_ARRAY) || (field->type == T1_FIELD_TYPE_BBOX)) {
    local_368.type = T1_FIELD_TYPE_FIXED;
  }
  tokens = local_338;
  ps_parser_to_token_array(parser,tokens,0x20,(FT_Int *)&local_36c);
  if ((int)local_36c < 0) {
    FVar5 = 0xa2;
  }
  else {
    uVar3 = field->array_max;
    if (local_36c < field->array_max) {
      uVar3 = local_36c;
    }
    pFVar1 = parser->cursor;
    pFVar2 = parser->limit;
    if ((field->type != T1_FIELD_TYPE_BBOX) && ((ulong)field->count_offset != 0)) {
      *(char *)((long)*objects + (ulong)field->count_offset) = (char)uVar3;
    }
    FVar5 = 0;
    if (uVar3 != 0) {
      uVar7 = (uint)local_368.size;
      iVar8 = uVar3 + 1;
      FVar6 = local_368.offset;
      do {
        FVar6 = FVar6 + uVar7;
        parser->cursor = tokens->start;
        parser->limit = tokens->limit;
        FVar5 = ps_parser_load_field(parser,&local_368,objects,max_objects,pflags);
        if (FVar5 != 0) goto LAB_0014c765;
        local_368.offset = FVar6;
        tokens = tokens + 1;
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      FVar5 = 0;
    }
LAB_0014c765:
    parser->cursor = pFVar1;
    parser->limit = pFVar2;
  }
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field_table( PS_Parser       parser,
                              const T1_Field  field,
                              void**          objects,
                              FT_UInt         max_objects,
                              FT_ULong*       pflags )
  {
    T1_TokenRec  elements[T1_MAX_TABLE_ELEMENTS];
    T1_Token     token;
    FT_Int       num_elements;
    FT_Error     error = FT_Err_Ok;
    FT_Byte*     old_cursor;
    FT_Byte*     old_limit;
    T1_FieldRec  fieldrec = *(T1_Field)field;


    fieldrec.type = T1_FIELD_TYPE_INTEGER;
    if ( field->type == T1_FIELD_TYPE_FIXED_ARRAY ||
         field->type == T1_FIELD_TYPE_BBOX        )
      fieldrec.type = T1_FIELD_TYPE_FIXED;

    ps_parser_to_token_array( parser, elements,
                              T1_MAX_TABLE_ELEMENTS, &num_elements );
    if ( num_elements < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( (FT_UInt)num_elements > field->array_max )
      num_elements = (FT_Int)field->array_max;

    old_cursor = parser->cursor;
    old_limit  = parser->limit;

    /* we store the elements count if necessary;           */
    /* we further assume that `count_offset' can't be zero */
    if ( field->type != T1_FIELD_TYPE_BBOX && field->count_offset != 0 )
      *(FT_Byte*)( (FT_Byte*)objects[0] + field->count_offset ) =
        (FT_Byte)num_elements;

    /* we now load each element, adjusting the field.offset on each one */
    token = elements;
    for ( ; num_elements > 0; num_elements--, token++ )
    {
      parser->cursor = token->start;
      parser->limit  = token->limit;

      error = ps_parser_load_field( parser,
                                    &fieldrec,
                                    objects,
                                    max_objects,
                                    0 );
      if ( error )
        break;

      fieldrec.offset += fieldrec.size;
    }

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    parser->cursor = old_cursor;
    parser->limit  = old_limit;

  Exit:
    return error;
  }